

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O2

void ddSymmSummary(DdManager *table,int lower,int upper,int *symvars,int *symgroups)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = 0;
  iVar4 = 0;
  for (; lower <= upper; lower = lower + 1) {
    uVar1 = lower;
    if (table->subtables[lower].next != lower) {
      do {
        uVar2 = uVar1;
        iVar3 = iVar3 + 1;
        uVar1 = table->subtables[(int)uVar2].next;
      } while (uVar1 != lower);
      iVar4 = iVar4 + 1;
      lower = uVar2;
    }
  }
  *symvars = iVar3;
  *symgroups = iVar4;
  return;
}

Assistant:

static void
ddSymmSummary(
  DdManager * table,
  int  lower,
  int  upper,
  int * symvars,
  int * symgroups)
{
    int i,x,gbot;
    int TotalSymm = 0;
    int TotalSymmGroups = 0;

    for (i = lower; i <= upper; i++) {
        if (table->subtables[i].next != (unsigned) i) {
            TotalSymmGroups++;
            x = i;
            do {
                TotalSymm++;
                gbot = x;
                x = table->subtables[x].next;
            } while (x != i);
#ifdef DD_DEBUG
            assert(table->subtables[gbot].next == (unsigned) i);
#endif
            i = gbot;
        }
    }
    *symvars = TotalSymm;
    *symgroups = TotalSymmGroups;

    return;

}